

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigint.h
# Opt level: O0

bool __thiscall
fast_float::large_add_from<(unsigned_short)62>
          (fast_float *this,stackvec<(unsigned_short)62> *x,limb_span y,size_t start)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  size_t sVar4;
  size_t sVar5;
  limb *plVar6;
  unsigned_long *puVar7;
  ulong uVar8;
  ulong uVar9;
  bool local_92;
  bool c2;
  bool c1;
  limb yi;
  limb xi;
  size_t index;
  bool carry;
  size_t start_local;
  stackvec<(unsigned_short)62> *x_local;
  limb_span y_local;
  limb z_1;
  limb z;
  
  uVar9 = y.length;
  y_local.ptr = y.ptr;
  x_local = x;
  sVar4 = stackvec<(unsigned_short)62>::len((stackvec<(unsigned_short)62> *)this);
  if (uVar9 <= sVar4) {
    sVar4 = span<unsigned_long>::len((span<unsigned_long> *)&x_local);
    sVar5 = stackvec<(unsigned_short)62>::len((stackvec<(unsigned_short)62> *)this);
    if (sVar4 <= sVar5 - uVar9) goto LAB_005ad5c0;
  }
  sVar4 = span<unsigned_long>::len((span<unsigned_long> *)&x_local);
  bVar3 = stackvec<(unsigned_short)62>::try_resize
                    ((stackvec<(unsigned_short)62> *)this,sVar4 + uVar9,0);
  if (!bVar3) {
    return false;
  }
LAB_005ad5c0:
  local_92 = false;
  for (xi = 0; sVar4 = span<unsigned_long>::len((span<unsigned_long> *)&x_local), xi < sVar4;
      xi = xi + 1) {
    plVar6 = stackvec<(unsigned_short)62>::operator[]
                       ((stackvec<(unsigned_short)62> *)this,xi + uVar9);
    uVar1 = *plVar6;
    puVar7 = span<unsigned_long>::operator[]((span<unsigned_long> *)&x_local,xi);
    uVar2 = *puVar7;
    uVar8 = uVar1 + uVar2;
    yi = uVar8;
    if (local_92) {
      yi = uVar8 + 1;
    }
    local_92 = local_92 && 0xfffffffffffffffe < uVar8;
    plVar6 = stackvec<(unsigned_short)62>::operator[]
                       ((stackvec<(unsigned_short)62> *)this,xi + uVar9);
    *plVar6 = yi;
    local_92 = CARRY8(uVar1,uVar2) || local_92;
  }
  if (local_92) {
    sVar4 = span<unsigned_long>::len((span<unsigned_long> *)&x_local);
    bVar3 = small_add_from<(unsigned_short)62>((stackvec<(unsigned_short)62> *)this,1,sVar4 + uVar9)
    ;
    if (!bVar3) {
      return false;
    }
  }
  return true;
}

Assistant:

FASTFLOAT_CONSTEXPR20
bool large_add_from(stackvec<size>& x, limb_span y, size_t start) noexcept {
  // the effective x buffer is from `xstart..x.len()`, so exit early
  // if we can't get that current range.
  if (x.len() < start || y.len() > x.len() - start) {
      FASTFLOAT_TRY(x.try_resize(y.len() + start, 0));
  }

  bool carry = false;
  for (size_t index = 0; index < y.len(); index++) {
    limb xi = x[index + start];
    limb yi = y[index];
    bool c1 = false;
    bool c2 = false;
    xi = scalar_add(xi, yi, c1);
    if (carry) {
      xi = scalar_add(xi, 1, c2);
    }
    x[index + start] = xi;
    carry = c1 | c2;
  }

  // handle overflow
  if (carry) {
    FASTFLOAT_TRY(small_add_from(x, 1, y.len() + start));
  }
  return true;
}